

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calculateEdgeLogLikelihoodsByPartition
          (BeagleCPUImpl<float,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *firstDerivativeIndices,int *secondDerivativeIndices,
          int *categoryWeightsIndices,int *stateFrequenciesIndices,int *cumulativeScaleIndices,
          int *partitionIndices,int partitionCount,int count,double *outSumLogLikelihoodByPartition,
          double *outSumLogLikelihood,double *outSumFirstDerivativeByPartition,
          double *outSumFirstDerivative,double *outSumSecondDerivativeByPartition,
          double *outSumSecondDerivative)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  ulong uVar4;
  double dVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  
  iVar3 = -7;
  if ((count == 1) && ((this->kFlags & 0x180) == 0)) {
    if (firstDerivativeIndices == (int *)0x0 && secondDerivativeIndices == (int *)0x0) {
      (**(code **)((long)(this->super_BeagleImpl)._vptr_BeagleImpl +
                  (ulong)((this->kThreadingEnabled ^ 1) << 4) + 0x268))();
      iVar3 = 0;
    }
    else {
      if (secondDerivativeIndices == (int *)0x0) {
        return -7;
      }
      (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x50])();
      *outSumFirstDerivative = 0.0;
      *outSumSecondDerivative = 0.0;
      auVar6 = ZEXT864(0) << 0x40;
      for (uVar4 = 0; (uint)(~(partitionCount >> 0x1f) & partitionCount) != uVar4; uVar4 = uVar4 + 1
          ) {
        *outSumFirstDerivative = outSumFirstDerivativeByPartition[uVar4] + *outSumFirstDerivative;
        auVar6 = ZEXT864((ulong)(outSumSecondDerivativeByPartition[uVar4] + *outSumSecondDerivative)
                        );
        *outSumSecondDerivative = outSumSecondDerivativeByPartition[uVar4] + *outSumSecondDerivative
        ;
      }
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *outSumFirstDerivative;
      uVar1 = vcmppd_avx512vl(auVar6._0_16_,ZEXT816(0) << 0x40,3);
      uVar2 = vcmppd_avx512vl(auVar7,ZEXT816(0) << 0x40,3);
      iVar3 = ((byte)~((byte)uVar2 & 3 | (byte)uVar1 & 3) & 1) * 8 + -8;
    }
    dVar5 = 0.0;
    *outSumLogLikelihood = 0.0;
    for (uVar4 = 0; (uint)(~(partitionCount >> 0x1f) & partitionCount) != uVar4; uVar4 = uVar4 + 1)
    {
      dVar5 = dVar5 + outSumLogLikelihoodByPartition[uVar4];
      *outSumLogLikelihood = dVar5;
    }
    if (NAN(dVar5)) {
      iVar3 = -8;
    }
  }
  return iVar3;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calculateEdgeLogLikelihoodsByPartition(
                                                    const int* parentBufferIndices,
                                                    const int* childBufferIndices,
                                                    const int* probabilityIndices,
                                                    const int* firstDerivativeIndices,
                                                    const int* secondDerivativeIndices,
                                                    const int* categoryWeightsIndices,
                                                    const int* stateFrequenciesIndices,
                                                    const int* cumulativeScaleIndices,
                                                    const int* partitionIndices,
                                                    int partitionCount,
                                                    int count,
                                                    double* outSumLogLikelihoodByPartition,
                                                    double* outSumLogLikelihood,
                                                    double* outSumFirstDerivativeByPartition,
                                                    double* outSumFirstDerivative,
                                                    double* outSumSecondDerivativeByPartition,
                                                    double* outSumSecondDerivative) {

    int returnCode = BEAGLE_SUCCESS;

    if (count == 1) {
        if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
            returnCode =  BEAGLE_ERROR_NO_IMPLEMENTATION;
        } else if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
            returnCode = BEAGLE_ERROR_NO_IMPLEMENTATION;
        } else {

            if (firstDerivativeIndices == NULL && secondDerivativeIndices == NULL) {

                if (kThreadingEnabled) {
                    calcEdgeLogLikelihoodsByPartitionAsync(parentBufferIndices,
                                                           childBufferIndices,
                                                           probabilityIndices,
                                                           categoryWeightsIndices,
                                                           stateFrequenciesIndices,
                                                           cumulativeScaleIndices,
                                                           partitionIndices,
                                                           partitionCount,
                                                           outSumLogLikelihoodByPartition);
                } else {
                    calcEdgeLogLikelihoodsByPartition(parentBufferIndices,
                                                      childBufferIndices,
                                                      probabilityIndices,
                                                      categoryWeightsIndices,
                                                      stateFrequenciesIndices,
                                                      cumulativeScaleIndices,
                                                      partitionIndices,
                                                      partitionCount,
                                                      outSumLogLikelihoodByPartition);
                }


            } else if (secondDerivativeIndices == NULL) {
                return BEAGLE_ERROR_NO_IMPLEMENTATION;
            } else {

                calcEdgeLogLikelihoodsSecondDerivByPartition(
                                                parentBufferIndices,
                                                childBufferIndices,
                                                probabilityIndices,
                                                firstDerivativeIndices,
                                                secondDerivativeIndices,
                                                categoryWeightsIndices,
                                                stateFrequenciesIndices,
                                                cumulativeScaleIndices,
                                                partitionIndices,
                                                partitionCount,
                                                outSumLogLikelihoodByPartition,
                                                outSumFirstDerivativeByPartition,
                                                outSumSecondDerivativeByPartition);

                *outSumFirstDerivative  = 0.0;
                *outSumSecondDerivative = 0.0;

                for (int i = 0; i < partitionCount; i++) {
                    *outSumFirstDerivative  += outSumFirstDerivativeByPartition[i];
                    *outSumSecondDerivative += outSumSecondDerivativeByPartition[i];
                }

                if (*outSumFirstDerivative  != *outSumFirstDerivative ||
                    *outSumSecondDerivative != *outSumSecondDerivative) {
                    returnCode = BEAGLE_ERROR_FLOATING_POINT;
                }
            }

            *outSumLogLikelihood = 0.0;

            for (int i = 0; i < partitionCount; i++) {
                *outSumLogLikelihood += outSumLogLikelihoodByPartition[i];
            }

            if (*outSumLogLikelihood != *outSumLogLikelihood) {
                returnCode = BEAGLE_ERROR_FLOATING_POINT;
            }

        }
    } else {
        returnCode = BEAGLE_ERROR_NO_IMPLEMENTATION;
    }

    return returnCode;
}